

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall Qclass_Qupdate_Test::TestBody(Qclass_Qupdate_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper AStack_16000;
  Message MStack_15ff8;
  int iStack_15fec;
  undefined1 auStack_15fe8 [8];
  AssertionResult gtest_ar;
  undefined1 auStack_15fc8 [8];
  Qclass Test;
  Qclass_Qupdate_Test *this_local;
  
  Qclass::Qclass((Qclass *)auStack_15fc8);
  Qclass::Qupdate((Qclass *)auStack_15fc8,0,0,0,0,0);
  iStack_15fec = -0x19;
  testing::internal::EqHelper<false>::Compare<double,int>
            ((EqHelper<false> *)auStack_15fe8,"Test.Q[0][0]","-25",
             (double *)(Test.grid[0x31] + 0x31),&iStack_15fec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)auStack_15fe8);
  if (!bVar1) {
    testing::Message::Message(&MStack_15ff8);
    message = testing::AssertionResult::failure_message((AssertionResult *)auStack_15fe8);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_16000,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sudrag[P]Q-learning-for-2D-Occupancy-Grid/test/test.cpp"
               ,0x2f,message);
    testing::internal::AssertHelper::operator=(&AStack_16000,&MStack_15ff8);
    testing::internal::AssertHelper::~AssertHelper(&AStack_16000);
    testing::Message::~Message(&MStack_15ff8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)auStack_15fe8);
  Qclass::~Qclass((Qclass *)auStack_15fc8);
  return;
}

Assistant:

TEST(Qclass, Qupdate) {
  Qclass Test;
  Test.Qupdate(0, 0, 0, 0, 0);
  EXPECT_EQ(Test.Q[0][0], -25);
}